

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ras_dec.c
# Opt level: O2

int ras_validate(jas_stream_t *in)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  ulong uVar4;
  undefined8 uStack_28;
  uchar buf [4];
  
  uStack_28 = in_RAX;
  uVar2 = jas_stream_read(in,buf,4);
  if (-1 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
    do {
      if ((long)uVar4 < 1) {
        if ((int)uVar2 < 4) {
          return -1;
        }
        return -(uint)(((uint)buf >> 0x18 | ((uint)buf & 0xff0000) >> 8 | ((uint)buf & 0xff00) << 8
                       | (int)buf << 0x18) != 0x59a66a95);
      }
      pbVar1 = (undefined1 *)((long)register0x00000020 + -0x25) + uVar4;
      uVar4 = uVar4 - 1;
      iVar3 = jas_stream_ungetc(in,(uint)*pbVar1);
    } while (iVar3 != -1);
  }
  return -1;
}

Assistant:

int ras_validate(jas_stream_t *in)
{
	jas_uchar buf[RAS_MAGICLEN];
	int i;
	int n;
	uint_fast32_t magic;

	assert(JAS_STREAM_MAXPUTBACK >= RAS_MAGICLEN);

	/* Read the validation data (i.e., the data used for detecting
	  the format). */
	if ((n = jas_stream_read(in, buf, RAS_MAGICLEN)) < 0) {
		return -1;
	}

	/* Put the validation data back onto the stream, so that the
	  stream position will not be changed. */
	for (i = n - 1; i >= 0; --i) {
		if (jas_stream_ungetc(in, buf[i]) == EOF) {
			return -1;
		}
	}

	/* Did we read enough data? */
	if (n < RAS_MAGICLEN) {
		return -1;
	}

	magic = (JAS_CAST(uint_fast32_t, buf[0]) << 24) |
	  (JAS_CAST(uint_fast32_t, buf[1]) << 16) |
	  (JAS_CAST(uint_fast32_t, buf[2]) << 8) |
	  buf[3];

	/* Is the signature correct for the Sun Rasterfile format? */
	if (magic != RAS_MAGIC) {
		return -1;
	}
	return 0;
}